

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

bool Search::should_print_update(vw *all,bool hit_new_pass)

{
  shared_data *psVar1;
  
  psVar1 = all->sd;
  if (((double)psVar1->dump_interval <=
       psVar1->weighted_labeled_examples + psVar1->weighted_unlabeled_examples) &&
     (all->quiet == false)) {
    return (bool)(all->bfgs ^ 1);
  }
  return false;
}

Assistant:

bool should_print_update(vw& all, bool hit_new_pass = false)
{
  // uncomment to print out final loss after all examples processed
  // commented for now so that outputs matches make test

  if (PRINT_UPDATE_EVERY_EXAMPLE)
    return true;
  if (PRINT_UPDATE_EVERY_PASS && hit_new_pass)
    return true;
  return (all.sd->weighted_examples() >= all.sd->dump_interval) && !all.quiet && !all.bfgs;
}